

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

VmConstant * CreateConstantBlock(Allocator *allocator,SynBase *source,VmBlock *block)

{
  int iVar1;
  undefined4 extraout_var;
  VmConstant *this;
  
  iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
  this = (VmConstant *)CONCAT44(extraout_var,iVar1);
  VmConstant::VmConstant(this,allocator,(VmType)ZEXT816((ulong)0x400000004),source);
  this->bValue = block;
  return this;
}

Assistant:

VmConstant* CreateConstantBlock(Allocator *allocator, SynBase *source, VmBlock *block)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Block, source);

	result->bValue = block;

	return result;
}